

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simSupp.c
# Opt level: O3

void Sim_UtilAssignRandom(Sim_Man_t *p)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  Abc_Ntk_t *pAVar6;
  Vec_Ptr_t *pVVar7;
  long lVar8;
  long lVar9;
  
  pAVar6 = p->pNtk;
  pVVar7 = pAVar6->vCis;
  if (0 < pVVar7->nSize) {
    uVar5 = (ulong)(uint)p->nSimWords;
    lVar9 = 0;
    do {
      if (0 < (int)uVar5) {
        pvVar1 = p->vSim0->pArray[*(int *)((long)pVVar7->pArray[lVar9] + 0x10)];
        lVar8 = 0;
        do {
          iVar2 = rand();
          iVar3 = rand();
          uVar4 = rand();
          *(uint *)((long)pvVar1 + lVar8 * 4) = uVar4 ^ iVar3 << 0xc ^ iVar2 << 0x18;
          lVar8 = lVar8 + 1;
          uVar5 = (ulong)p->nSimWords;
        } while (lVar8 < (long)uVar5);
        pAVar6 = p->pNtk;
      }
      lVar9 = lVar9 + 1;
      pVVar7 = pAVar6->vCis;
    } while (lVar9 < pVVar7->nSize);
  }
  return;
}

Assistant:

void Sim_UtilAssignRandom( Sim_Man_t * p )
{
    Abc_Obj_t * pNode;
    unsigned * pSimInfo;
    int i, k;
    // assign the random/systematic simulation info to the PIs
    Abc_NtkForEachCi( p->pNtk, pNode, i )
    {
        pSimInfo = (unsigned *)p->vSim0->pArray[pNode->Id];
        for ( k = 0; k < p->nSimWords; k++ )
            pSimInfo[k] = SIM_RANDOM_UNSIGNED;
    }
}